

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O2

int ConnectPathfinderDVL(PATHFINDERDVL *pPathfinderDVL,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char line [256];
  
  memset(pPathfinderDVL->szCfgFilePath,0,0x100);
  sprintf(pPathfinderDVL->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(line,0,0x100);
    memset(pPathfinderDVL->szDevPath + 5,0,0xfb);
    builtin_strncpy(pPathfinderDVL->szDevPath,"COM1",5);
    pPathfinderDVL->BaudRate = 0x1c200;
    pPathfinderDVL->timeout = 0x5dc;
    pPathfinderDVL->threadperiod = 100;
    pPathfinderDVL->bSaveRawData = 1;
    pPathfinderDVL->StartupDelay = 4000;
    pPathfinderDVL->bSendBreak = 1;
    pPathfinderDVL->BreakMode = 1;
    pPathfinderDVL->BreakDuration = 300;
    pPathfinderDVL->bRetrieveParameters = 1;
    pPathfinderDVL->Parameters = 1;
    pPathfinderDVL->bSetHeadingAlignment = 1;
    pPathfinderDVL->HeadingAlignment = 45.0;
    pPathfinderDVL->bSetRollPitchMisalignment = 0;
    pPathfinderDVL->RollMisalignment = 0.0;
    pPathfinderDVL->PitchMisalignment = 0.0;
    pPathfinderDVL->bUpOrientation = 0;
    pPathfinderDVL->bSelectDataStream = 1;
    pPathfinderDVL->DataStream = 6;
    pPathfinderDVL->bEnableAutoPing = 0;
    pPathfinderDVL->bKeepAsUserDefaults = 1;
    pPathfinderDVL->bStartPinging = 1;
    pPathfinderDVL->bEnable_PD6_SA = 0;
    pPathfinderDVL->bEnable_PD6_TS = 0;
    pPathfinderDVL->bEnable_PD6_BI = 0;
    pPathfinderDVL->bEnable_PD6_BS = 1;
    pPathfinderDVL->bEnable_PD6_BE = 0;
    pPathfinderDVL->bEnable_PD6_BD = 0;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%255s",pPathfinderDVL->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bSaveRawData);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->StartupDelay);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bSendBreak);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->BreakMode);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->BreakDuration);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bRetrieveParameters);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->Parameters);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bSetHeadingAlignment);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pPathfinderDVL->HeadingAlignment);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bSetRollPitchMisalignment);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pPathfinderDVL->RollMisalignment);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%lf",&pPathfinderDVL->PitchMisalignment);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bUpOrientation);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bSelectDataStream);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->DataStream);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bEnableAutoPing);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bKeepAsUserDefaults);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bStartPinging);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bEnable_PD6_SA);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bEnable_PD6_TS);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bEnable_PD6_BI);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bEnable_PD6_BS);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bEnable_PD6_BE);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pPathfinderDVL->bEnable_PD6_BD);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_0017b801;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_0017b801:
  if (pPathfinderDVL->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pPathfinderDVL->threadperiod = 100;
  }
  if (pPathfinderDVL->BreakDuration < 0) {
    puts("Invalid parameter : BreakDuration.");
    pPathfinderDVL->BreakDuration = 300;
  }
  if (2 < (uint)pPathfinderDVL->Parameters) {
    puts("Invalid parameter : Parameters.");
    pPathfinderDVL->Parameters = 1;
  }
  if (0xd < (uint)pPathfinderDVL->DataStream) {
    puts("Invalid parameter : DataStream.");
    pPathfinderDVL->DataStream = 6;
  }
  mSleep((long)pPathfinderDVL->StartupDelay);
  iVar1 = OpenRS232Port(&pPathfinderDVL->RS232Port,pPathfinderDVL->szDevPath);
  if (iVar1 != 0) {
    puts("Unable to connect to a PathfinderDVL.");
    return 1;
  }
  iVar1 = SetOptionsRS232Port(&pPathfinderDVL->RS232Port,pPathfinderDVL->BaudRate,'\0',0,'\b','\0',
                              pPathfinderDVL->timeout);
  if (iVar1 != 0) {
    pcVar2 = "Unable to connect to a PathfinderDVL.";
LAB_0017b8d7:
    puts(pcVar2);
    CloseRS232Port(&pPathfinderDVL->RS232Port);
    return 1;
  }
  mSleep(100);
  if (pPathfinderDVL->bSendBreak != 0) {
    iVar1 = SendBreakPathfinderDVL
                      (pPathfinderDVL,pPathfinderDVL->BreakMode,pPathfinderDVL->BreakDuration);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : break failed.";
      goto LAB_0017b8d7;
    }
    mSleep(500);
  }
  if (pPathfinderDVL->bRetrieveParameters != 0) {
    iVar1 = RetrieveParametersPathfinderDVL(pPathfinderDVL,pPathfinderDVL->Parameters);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : CR command failed.";
      goto LAB_0017b8d7;
    }
    mSleep(100);
  }
  if (pPathfinderDVL->bSetHeadingAlignment != 0) {
    iVar1 = SetHeadingAlignmentPathfinderDVL(pPathfinderDVL,pPathfinderDVL->HeadingAlignment);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : EA command failed.";
      goto LAB_0017b8d7;
    }
    mSleep(100);
  }
  if (pPathfinderDVL->bSetRollPitchMisalignment != 0) {
    iVar1 = SetRollPitchMisalignmentPathfinderDVL
                      (pPathfinderDVL,pPathfinderDVL->RollMisalignment,
                       pPathfinderDVL->PitchMisalignment);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : #EI or #EJ commands failed.";
      goto LAB_0017b8d7;
    }
    mSleep(100);
  }
  if (pPathfinderDVL->bUpOrientation != 0) {
    iVar1 = SetUpDownOrientationPathfinderDVL(pPathfinderDVL,pPathfinderDVL->bUpOrientation);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : EU command failed.";
      goto LAB_0017b8d7;
    }
    mSleep(100);
  }
  if (pPathfinderDVL->bSelectDataStream != 0) {
    iVar1 = SelectDataStreamPathfinderDVL(pPathfinderDVL,pPathfinderDVL->DataStream);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : PD command failed.";
      goto LAB_0017b8d7;
    }
    mSleep(100);
  }
  if (pPathfinderDVL->bEnableAutoPing != 0) {
    iVar1 = SetTurnkeyPathfinderDVL(pPathfinderDVL,pPathfinderDVL->bEnableAutoPing);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : CT command failed.";
      goto LAB_0017b8d7;
    }
    mSleep(100);
  }
  if (pPathfinderDVL->bKeepAsUserDefaults != 0) {
    iVar1 = KeepAsUserDefaultsPathfinderDVL(pPathfinderDVL);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : CK command failed.";
      goto LAB_0017b8d7;
    }
    mSleep(100);
  }
  if (pPathfinderDVL->bStartPinging != 0) {
    iVar1 = StartPingingPathfinderDVL(pPathfinderDVL);
    if (iVar1 != 0) {
      pcVar2 = "Unable to configure a PathfinderDVL : CS command failed.";
      goto LAB_0017b8d7;
    }
    mSleep(100);
  }
  puts("PathfinderDVL connected.");
  return 0;
}

Assistant:

inline int ConnectPathfinderDVL(PATHFINDERDVL* pPathfinderDVL, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pPathfinderDVL->szCfgFilePath, 0, sizeof(pPathfinderDVL->szCfgFilePath));
	sprintf(pPathfinderDVL->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pPathfinderDVL->szDevPath, 0, sizeof(pPathfinderDVL->szDevPath));
		sprintf(pPathfinderDVL->szDevPath, "COM1");
		pPathfinderDVL->BaudRate = 115200;
		pPathfinderDVL->timeout = 1500;
		pPathfinderDVL->threadperiod = 100;
		pPathfinderDVL->bSaveRawData = 1;
		pPathfinderDVL->StartupDelay = 4000;
		pPathfinderDVL->bSendBreak = 1;
		pPathfinderDVL->BreakMode = 1;
		pPathfinderDVL->BreakDuration = 300;
		pPathfinderDVL->bRetrieveParameters = 1;
		pPathfinderDVL->Parameters = 1;
		pPathfinderDVL->bSetHeadingAlignment = 1;
		pPathfinderDVL->HeadingAlignment = 45;
		pPathfinderDVL->bSetRollPitchMisalignment = 0;
		pPathfinderDVL->RollMisalignment = 0;
		pPathfinderDVL->PitchMisalignment = 0;
		pPathfinderDVL->bUpOrientation = 0;
		pPathfinderDVL->bSelectDataStream = 1;
		pPathfinderDVL->DataStream = 6;
		pPathfinderDVL->bEnableAutoPing = 0;
		pPathfinderDVL->bKeepAsUserDefaults = 1;
		pPathfinderDVL->bStartPinging = 1;
		pPathfinderDVL->bEnable_PD6_SA = 0;
		pPathfinderDVL->bEnable_PD6_TS = 0;
		pPathfinderDVL->bEnable_PD6_BI = 0;
		pPathfinderDVL->bEnable_PD6_BS = 1;
		pPathfinderDVL->bEnable_PD6_BE = 0;
		pPathfinderDVL->bEnable_PD6_BD = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pPathfinderDVL->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->StartupDelay) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSendBreak) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->BreakMode) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->BreakDuration) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bRetrieveParameters) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->Parameters) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSetHeadingAlignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pPathfinderDVL->HeadingAlignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSetRollPitchMisalignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pPathfinderDVL->RollMisalignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &pPathfinderDVL->PitchMisalignment) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bUpOrientation) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bSelectDataStream) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->DataStream) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnableAutoPing) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bKeepAsUserDefaults) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bStartPinging) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_SA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_TS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_BI) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_BS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_BE) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pPathfinderDVL->bEnable_PD6_BD) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}
	
	if (pPathfinderDVL->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pPathfinderDVL->threadperiod = 100;
	}
	if (pPathfinderDVL->BreakDuration < 0)
	{
		printf("Invalid parameter : BreakDuration.\n");
		pPathfinderDVL->BreakDuration = 300;
	}
	if ((pPathfinderDVL->Parameters < 0)||(pPathfinderDVL->Parameters > 2))
	{
		printf("Invalid parameter : Parameters.\n");
		pPathfinderDVL->Parameters = 1;
	}
	if ((pPathfinderDVL->DataStream < 0)||(pPathfinderDVL->DataStream > 13))
	{
		printf("Invalid parameter : DataStream.\n");
		pPathfinderDVL->DataStream = 6;
	}

	// Used to save raw data, should be handled specifically...
	//pPathfinderDVL->pfSaveFile = NULL;

	//pPathfinderDVL->LastAltitude = 0;
	
	// When the DVL restarts, it might silently miss the first commands if it is not yet ready
	// (however this is unlikely to be a real problem as long as the correct parameters were saved).
	// Or maybe try to send break and retry until their is the prompt?
	mSleep(pPathfinderDVL->StartupDelay);

	if (OpenRS232Port(&pPathfinderDVL->RS232Port, pPathfinderDVL->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a PathfinderDVL.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pPathfinderDVL->RS232Port, pPathfinderDVL->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pPathfinderDVL->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a PathfinderDVL.\n");
		CloseRS232Port(&pPathfinderDVL->RS232Port);
		return EXIT_FAILURE;
	}
	
	mSleep(100);

	if (pPathfinderDVL->bSendBreak)
	{
		if (SendBreakPathfinderDVL(pPathfinderDVL, pPathfinderDVL->BreakMode, pPathfinderDVL->BreakDuration) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : break failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(500);
	}

	if (pPathfinderDVL->bRetrieveParameters)
	{
		if (RetrieveParametersPathfinderDVL(pPathfinderDVL, pPathfinderDVL->Parameters) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : CR command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bSetHeadingAlignment)
	{
		if (SetHeadingAlignmentPathfinderDVL(pPathfinderDVL, pPathfinderDVL->HeadingAlignment) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : EA command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bSetRollPitchMisalignment)
	{
		if (SetRollPitchMisalignmentPathfinderDVL(pPathfinderDVL, pPathfinderDVL->RollMisalignment, pPathfinderDVL->PitchMisalignment) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : #EI or #EJ commands failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bUpOrientation)
	{
		if (SetUpDownOrientationPathfinderDVL(pPathfinderDVL, pPathfinderDVL->bUpOrientation) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : EU command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bSelectDataStream)
	{
		if (SelectDataStreamPathfinderDVL(pPathfinderDVL, pPathfinderDVL->DataStream) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : PD command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bEnableAutoPing)
	{
		if (SetTurnkeyPathfinderDVL(pPathfinderDVL, pPathfinderDVL->bEnableAutoPing) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : CT command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bKeepAsUserDefaults)
	{
		if (KeepAsUserDefaultsPathfinderDVL(pPathfinderDVL) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : CK command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}

	if (pPathfinderDVL->bStartPinging)
	{
		if (StartPingingPathfinderDVL(pPathfinderDVL) != EXIT_SUCCESS)
		{
			printf("Unable to configure a PathfinderDVL : CS command failed.\n");
			CloseRS232Port(&pPathfinderDVL->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(100);
	}
	
	printf("PathfinderDVL connected.\n");

	return EXIT_SUCCESS;
}